

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

int ON::IsOpenNURBSFile(FILE *fp)

{
  int iVar1;
  bool bVar2;
  undefined1 local_250 [8];
  ON_BinaryFile archive;
  int version;
  ON_String sStartSectionComment;
  FILE *fp_local;
  
  sStartSectionComment.m_s = (char *)fp;
  ON_String::ON_String((ON_String *)&stack0xffffffffffffffe8);
  archive.m_memory_buffer._4_4_ = 0;
  if (sStartSectionComment.m_s != (char *)0x0) {
    ON_BinaryFile::ON_BinaryFile
              ((ON_BinaryFile *)local_250,read3dm,(FILE *)sStartSectionComment.m_s);
    bVar2 = ON_BinaryArchive::Read3dmStartSection
                      ((ON_BinaryArchive *)local_250,(int *)((long)&archive.m_memory_buffer + 4),
                       (ON_String *)&stack0xffffffffffffffe8);
    if (!bVar2) {
      archive.m_memory_buffer._4_4_ = 0;
    }
    ON_BinaryFile::~ON_BinaryFile((ON_BinaryFile *)local_250);
  }
  iVar1 = archive.m_memory_buffer._4_4_;
  ON_String::~ON_String((ON_String *)&stack0xffffffffffffffe8);
  return iVar1;
}

Assistant:

int ON::IsOpenNURBSFile( FILE* fp )
{
  ON_String sStartSectionComment;
  int version = 0;
  if ( 0 != fp )
  {
    ON_BinaryFile archive(ON::archive_mode::read3dm,fp);
    if ( !archive.Read3dmStartSection(&version,sStartSectionComment) )
      version = 0;
  }
  return version;
}